

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeoffsets_tests.cpp
# Opt level: O1

void __thiscall timeoffsets_tests::timeoffsets::test_method(timeoffsets *this)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  element_type *peVar3;
  seconds sVar4;
  void *pvVar5;
  long lVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  element_type *peVar9;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  const_string file;
  initializer_list<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> __l;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  TimeOffsets offsets;
  Warnings warnings;
  check_type cVar12;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  assertion_result local_170;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  undefined1 local_138 [40];
  undefined1 auStack_110 [24];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  _Map_pointer local_c8;
  Warnings *local_c0;
  lazy_ostream local_b8;
  undefined1 *local_a8;
  char **ppcStack_a0;
  Warnings local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ::node::Warnings::Warnings(&local_90);
  local_d8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  auStack_110._8_16_ = (undefined1  [16])0x0;
  stack0xfffffffffffffee8 = (undefined1  [16])0x0;
  local_138._16_16_ = (undefined1  [16])0x0;
  local_138._0_16_ = (undefined1  [16])0x0;
  local_c8 = (_Map_pointer)0x0;
  std::
  _Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::_M_initialize_map((_Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                       *)auStack_110,0);
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1e;
  file.m_begin = (iterator)&local_148;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  local_c0 = &local_90;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_158,msg);
  sVar4 = TimeOffsets::Median((TimeOffsets *)local_138);
  local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(sVar4.__r == 0);
  local_170.m_message.px = (element_type *)0x0;
  local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ppcStack_a0 = &local_180;
  local_180 = "offsets.Median() == 0s";
  local_178 = "";
  local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
  local_b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_188 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_170,&local_b8,1,0,WARN,_cVar12,(size_t)&local_190,0x1e);
  boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
  local_a8 = (undefined1 *)0xfffffffffffffffe;
  ppcStack_a0 = (char **)0xfffffffffffffffd;
  local_b8._vptr_lazy_ostream = (_func_int **)0x0;
  local_b8._8_8_ = 0xffffffffffffffff;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_b8;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::vector((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            *)&local_170,__l,(allocator_type *)&local_180);
  peVar9 = (element_type *)
           CONCAT71(local_170._1_7_,
                    local_170.p_predicate_value.super_readonly_property<bool>.
                    super_class_property<bool>.value);
  peVar3 = local_170.m_message.px;
  if (peVar9 != local_170.m_message.px) {
    do {
      TimeOffsets::Add((TimeOffsets *)local_138,
                       (seconds)(peVar9->m_stream).
                                super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream);
      peVar9 = (element_type *)
               &(peVar9->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    } while (peVar9 != peVar3);
  }
  pvVar5 = (void *)CONCAT71(local_170._1_7_,
                            local_170.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,(long)local_170.m_message.pn.pi_ - (long)pvVar5);
  }
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x22;
  file_00.m_begin = (iterator)&local_1a0;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1b0,
             msg_00);
  sVar4 = TimeOffsets::Median((TimeOffsets *)local_138);
  local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(sVar4.__r == 0);
  local_170.m_message.px = (element_type *)0x0;
  local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_180 = "offsets.Median() == 0s";
  local_178 = "";
  local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
  local_b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  ppcStack_a0 = &local_180;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_1b8 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_170,&local_b8,1,0,WARN,_cVar12,(size_t)&local_1c0,0x22);
  boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
  TimeOffsets::Add((TimeOffsets *)local_138,(seconds)0xfffffffffffffffc);
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x26;
  file_01.m_begin = (iterator)&local_1d0;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1e0,
             msg_01);
  sVar4 = TimeOffsets::Median((TimeOffsets *)local_138);
  local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(sVar4.__r == -2);
  local_170.m_message.px = (element_type *)0x0;
  local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_180 = "offsets.Median() == -2s";
  local_178 = "";
  local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
  local_b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  ppcStack_a0 = &local_180;
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_1e8 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_170,&local_b8,1,0,WARN,_cVar12,(size_t)&local_1f0,0x26);
  boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
  pvVar5 = operator_new(0x20);
  lVar6 = 0;
  do {
    puVar1 = (undefined8 *)((long)pvVar5 + lVar6 * 8);
    *puVar1 = 5;
    puVar1[1] = 5;
    lVar6 = lVar6 + 2;
  } while (lVar6 != 4);
  lVar6 = 0;
  do {
    TimeOffsets::Add((TimeOffsets *)local_138,(seconds)*(rep *)((long)pvVar5 + lVar6));
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x20);
  operator_delete(pvVar5,0x20);
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x2a;
  file_02.m_begin = (iterator)&local_200;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_210,
             msg_02);
  sVar4 = TimeOffsets::Median((TimeOffsets *)local_138);
  local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(sVar4.__r == 0);
  local_170.m_message.px = (element_type *)0x0;
  local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_180 = "offsets.Median() == 0s";
  local_178 = "";
  local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
  local_b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  ppcStack_a0 = &local_180;
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_218 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_170,&local_b8,1,0,WARN,_cVar12,(size_t)&local_220,0x2a);
  boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
  pvVar5 = operator_new(0x148);
  lVar6 = 0;
  do {
    auVar10._8_4_ = (int)lVar6;
    auVar10._0_8_ = lVar6;
    auVar10._12_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar10 = (auVar10 | _DAT_00e98180) ^ _DAT_00e98190;
    if (auVar10._4_4_ == -0x80000000 && auVar10._0_4_ < -0x7fffffd7) {
      *(undefined8 *)((long)pvVar5 + lVar6 * 8) = 10;
      *(undefined8 *)((long)pvVar5 + lVar6 * 8 + 8) = 10;
    }
    lVar6 = lVar6 + 2;
  } while (lVar6 != 0x2a);
  lVar6 = 0;
  do {
    TimeOffsets::Add((TimeOffsets *)local_138,(seconds)*(rep *)((long)pvVar5 + lVar6));
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x148);
  operator_delete(pvVar5,0x148);
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x2e;
  file_03.m_begin = (iterator)&local_230;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_240,
             msg_03);
  sVar4 = TimeOffsets::Median((TimeOffsets *)local_138);
  local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(sVar4.__r == 10);
  local_170.m_message.px = (element_type *)0x0;
  local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_180 = "offsets.Median() == 10s";
  local_178 = "";
  local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
  local_b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  ppcStack_a0 = &local_180;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_248 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_170,&local_b8,1,0,WARN,_cVar12,(size_t)&local_250,0x2e);
  boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
  pvVar5 = operator_new(200);
  auVar2 = _DAT_00e98190;
  auVar10 = _DAT_00e98180;
  lVar6 = 0;
  do {
    auVar11._8_4_ = (int)lVar6;
    auVar11._0_8_ = lVar6;
    auVar11._12_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar11 = (auVar11 | auVar10) ^ auVar2;
    if (auVar11._4_4_ == -0x80000000 && auVar11._0_4_ < -0x7fffffe7) {
      *(undefined8 *)((long)pvVar5 + lVar6 * 8) = 0xf;
      *(undefined8 *)((long)pvVar5 + lVar6 * 8 + 8) = 0xf;
    }
    lVar6 = lVar6 + 2;
  } while (lVar6 != 0x1a);
  lVar6 = 0;
  do {
    TimeOffsets::Add((TimeOffsets *)local_138,(seconds)*(rep *)((long)pvVar5 + lVar6));
    lVar6 = lVar6 + 8;
  } while (lVar6 != 200);
  operator_delete(pvVar5,200);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x32;
  file_04.m_begin = (iterator)&local_260;
  msg_04.m_end = pvVar8;
  msg_04.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_270,
             msg_04);
  sVar4 = TimeOffsets::Median((TimeOffsets *)local_138);
  local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(sVar4.__r == 0xf);
  local_170.m_message.px = (element_type *)0x0;
  local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_180 = "offsets.Median() == 15s";
  local_178 = "";
  local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
  local_b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  ppcStack_a0 = &local_180;
  boost::test_tools::tt_detail::report_assertion
            (&local_170,&local_b8,1,0,WARN,0xf6d242,(size_t)&stack0xfffffffffffffd80,0x32);
  boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
  std::
  _Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::~_Deque_base((_Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                  *)auStack_110);
  std::
  _Rb_tree<std::variant<kernel::Warning,_node::Warning>,_std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>,_std::_Select1st<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>,_std::less<std::variant<kernel::Warning,_node::Warning>_>,_std::allocator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>_>
  ::~_Rb_tree(&local_90.m_warnings._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(timeoffsets)
{
    node::Warnings warnings{};
    TimeOffsets offsets{warnings};
    BOOST_CHECK(offsets.Median() == 0s);

    AddMulti(offsets, {{0s, -1s, -2s, -3s}});
    // median should be zero for < 5 offsets
    BOOST_CHECK(offsets.Median() == 0s);

    offsets.Add(-4s);
    // we now have 5 offsets: [-4, -3, -2, -1, 0]
    BOOST_CHECK(offsets.Median() == -2s);

    AddMulti(offsets, {4, 5s});
    // we now have 9 offsets: [-4, -3, -2, -1, 0, 5, 5, 5, 5]
    BOOST_CHECK(offsets.Median() == 0s);

    AddMulti(offsets, {41, 10s});
    // the TimeOffsets is now at capacity with 50 offsets, oldest offsets is discarded for any additional offset
    BOOST_CHECK(offsets.Median() == 10s);

    AddMulti(offsets, {25, 15s});
    // we now have 25 offsets of 10s followed by 25 offsets of 15s
    BOOST_CHECK(offsets.Median() == 15s);
}